

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

size_t SSL_get0_peer_verify_algorithms(SSL *ssl,uint16_t **out_sigalgs)

{
  bool bVar1;
  pointer pSVar2;
  unsigned_short *puVar3;
  size_t sVar4;
  unsigned_short *local_38;
  unsigned_short *local_30;
  undefined1 local_28 [8];
  Span<const_unsigned_short> sigalgs;
  uint16_t **out_sigalgs_local;
  SSL *ssl_local;
  
  sigalgs.size_ = (size_t)out_sigalgs;
  bssl::Span<const_unsigned_short>::Span((Span<const_unsigned_short> *)local_28);
  bVar1 = std::operator!=(&ssl->s3->hs,(nullptr_t)0x0);
  if (bVar1) {
    pSVar2 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&ssl->s3->hs)
    ;
    bssl::Span<unsigned_short_const>::
    Span<bssl::Array<unsigned_short>,void,bssl::Array<unsigned_short>>
              ((Span<unsigned_short_const> *)&local_38,&pSVar2->peer_sigalgs);
    local_28 = (undefined1  [8])local_38;
    sigalgs.data_ = local_30;
  }
  puVar3 = bssl::Span<const_unsigned_short>::data((Span<const_unsigned_short> *)local_28);
  *(unsigned_short **)sigalgs.size_ = puVar3;
  sVar4 = bssl::Span<const_unsigned_short>::size((Span<const_unsigned_short> *)local_28);
  return sVar4;
}

Assistant:

size_t SSL_get0_peer_verify_algorithms(const SSL *ssl,
                                       const uint16_t **out_sigalgs) {
  Span<const uint16_t> sigalgs;
  if (ssl->s3->hs != nullptr) {
    sigalgs = ssl->s3->hs->peer_sigalgs;
  }
  *out_sigalgs = sigalgs.data();
  return sigalgs.size();
}